

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_utils.c
# Opt level: O3

cupdlp_retcode
scaling_Alloc(CUPDLPscaling *scaling,CUPDLPproblem *problem,cupdlp_int ncols,cupdlp_int nrows)

{
  cupdlp_float *pcVar1;
  cupdlp_retcode cVar2;
  double dVar3;
  
  scaling->ifScaled = 0;
  pcVar1 = (cupdlp_float *)malloc((long)ncols << 3);
  scaling->colScale = pcVar1;
  cVar2 = 1;
  if (pcVar1 != (cupdlp_float *)0x0) {
    pcVar1 = (cupdlp_float *)malloc((long)nrows << 3);
    scaling->rowScale = pcVar1;
    if (pcVar1 != (cupdlp_float *)0x0) {
      scaling->ifRuizScaling = 1;
      scaling->ifL2Scaling = 0;
      scaling->ifPcScaling = 1;
      dVar3 = twoNorm(problem->cost,problem->nCols);
      scaling->dNormCost = dVar3;
      dVar3 = twoNorm(problem->rhs,problem->nRows);
      scaling->dNormRhs = dVar3;
      cVar2 = 0;
    }
  }
  return cVar2;
}

Assistant:

cupdlp_retcode scaling_Alloc(CUPDLPscaling *scaling, CUPDLPproblem *problem,
                             cupdlp_int ncols, cupdlp_int nrows) {
  cupdlp_retcode retcode = RETCODE_OK;
  scaling->ifScaled = 0;

  CUPDLP_INIT_DOUBLE(scaling->colScale, ncols);
  CUPDLP_INIT_DOUBLE(scaling->rowScale, nrows);

  scaling->ifRuizScaling = 1;
  scaling->ifL2Scaling = 0;
  scaling->ifPcScaling = 1;

  scaling->dNormCost = twoNorm(problem->cost, problem->nCols);
  scaling->dNormRhs = twoNorm(problem->rhs, problem->nRows);

exit_cleanup:
  return retcode;
}